

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O0

Gia_Man_t * Bmc_CexBuildNetwork2(Gia_Man_t *p,Abc_Cex_t *pCex,int fStart)

{
  undefined8 uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  bool bVar11;
  int local_5c;
  int local_58;
  int iBit;
  int k;
  int i;
  int fCompl1;
  int fCompl0;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fStart_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  if (pCex->nRegs != 0) {
    __assert_fail("pCex->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x86,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  iVar4 = pCex->nPis;
  iVar3 = Gia_ManCiNum(p);
  if (iVar4 != iVar3) {
    __assert_fail("pCex->nPis == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x87,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (pCex->iFrame < fStart) {
    __assert_fail("fStart <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x88,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  p_00 = Gia_ManStart(1000);
  pcVar8 = Abc_UtilStrsav("unate");
  p_00->pName = pcVar8;
  pGVar9 = Gia_ManConst0(p);
  *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xffffffffbfffffff;
  pGVar9 = Gia_ManConst0(p);
  *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xbfffffffffffffff | 0x4000000000000000;
  pGVar9 = Gia_ManConst0(p);
  pGVar9->Value = 0xffffffff;
  local_58 = 0;
  while( true ) {
    iVar4 = Gia_ManRegNum(p);
    bVar11 = false;
    if (local_58 < iVar4) {
      iVar4 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar4 + local_58);
      bVar11 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    iVar4 = pCex->nRegs;
    iVar3 = Gia_ManCiNum(p);
    iVar5 = Gia_ManPiNum(p);
    uVar7 = Abc_InfoHasBit((uint *)(pCex + 1),iVar4 + fStart * iVar3 + iVar5 + local_58);
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar7 & 1) << 0x1e;
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff;
    iVar4 = Gia_ManAppendCi(p_00);
    uVar7 = Abc_LitNotCond(iVar4,(uint)(((*(ulong *)pObjRo >> 0x1e & 1) != 0 ^ 0xffU) & 1));
    pObjRo->Value = uVar7;
    local_58 = local_58 + 1;
  }
  Gia_ManHashAlloc(p_00);
  local_5c = pCex->nRegs;
  iVar4 = Gia_ManCiNum(p);
  local_5c = local_5c + fStart * iVar4;
  for (iBit = fStart; iBit <= pCex->iFrame; iBit = iBit + 1) {
    local_58 = 0;
    while( true ) {
      iVar4 = Gia_ManPiNum(p);
      bVar11 = false;
      if (local_58 < iVar4) {
        pObjRo = Gia_ManCi(p,local_58);
        bVar11 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      uVar7 = Abc_InfoHasBit((uint *)(pCex + 1),local_5c);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar7 & 1) << 0x1e;
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff | 0x4000000000000000;
      pObjRo->Value = 0xffffffff;
      local_58 = local_58 + 1;
      local_5c = local_5c + 1;
    }
    iVar4 = Gia_ManRegNum(p);
    local_5c = iVar4 + local_5c;
    local_58 = 0;
    while( true ) {
      iVar4 = Gia_ManRegNum(p);
      bVar11 = false;
      if (local_58 < iVar4) {
        iVar4 = Gia_ManPoNum(p);
        _fCompl1 = Gia_ManCo(p,iVar4 + local_58);
        bVar11 = false;
        if (_fCompl1 != (Gia_Obj_t *)0x0) {
          iVar4 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar4 + local_58);
          bVar11 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar11) break;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           (ulong)((uint)(*(ulong *)_fCompl1 >> 0x1e) & 1) << 0x1e;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xbfffffffffffffff |
           (ulong)((uint)(*(ulong *)_fCompl1 >> 0x3e) & 1) << 0x3e;
      pObjRi->Value = _fCompl1->Value;
      local_58 = local_58 + 1;
    }
    local_58 = 0;
    while( true ) {
      bVar11 = false;
      if (local_58 < p->nObjs) {
        pObjRo = Gia_ManObj(p,local_58);
        bVar11 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      iVar4 = Gia_ObjIsAnd(pObjRo);
      if (iVar4 != 0) {
        pGVar9 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar9;
        uVar7 = Gia_ObjFaninC0(pObjRo);
        uVar7 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar7;
        pGVar9 = Gia_ObjFanin1(pObjRo);
        uVar2 = *(ulong *)pGVar9;
        uVar6 = Gia_ObjFaninC1(pObjRo);
        uVar6 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar6;
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)(uVar7 & uVar6) & 1) << 0x1e;
        if ((*(ulong *)pObjRo >> 0x1e & 1) == 0) {
          if ((uVar7 == 0) && (uVar6 == 0)) {
            pGVar9 = Gia_ObjFanin0(pObjRo);
            uVar1 = *(undefined8 *)pGVar9;
            pGVar9 = Gia_ObjFanin1(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 |
                        (uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1) << 0x3e;
          }
          else if (uVar7 == 0) {
            pGVar9 = Gia_ObjFanin0(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1) << 0x3e;
          }
          else {
            if (uVar6 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                            ,0xb8,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
            }
            pGVar9 = Gia_ObjFanin1(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1) << 0x3e;
          }
        }
        else {
          pGVar9 = Gia_ObjFanin0(pObjRo);
          uVar1 = *(undefined8 *)pGVar9;
          pGVar9 = Gia_ObjFanin1(pObjRo);
          *(ulong *)pObjRo =
               *(ulong *)pObjRo & 0xbfffffffffffffff |
               (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 &
                      (uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1) << 0x3e;
        }
        pObjRo->Value = 0xffffffff;
        if ((*(ulong *)pObjRo >> 0x3e & 1) == 0) {
          if ((*(ulong *)pObjRo >> 0x1e & 1) == 0) {
            if ((uVar7 == 0) && (uVar6 == 0)) {
              pGVar9 = Gia_ObjFanin0(pObjRo);
              uVar7 = pGVar9->Value;
              pGVar9 = Gia_ObjFanin1(pObjRo);
              uVar7 = Gia_ManHashOr(p_00,uVar7,pGVar9->Value);
              pObjRo->Value = uVar7;
            }
            else if (uVar7 == 0) {
              pGVar9 = Gia_ObjFanin0(pObjRo);
              pObjRo->Value = pGVar9->Value;
            }
            else {
              if (uVar6 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                              ,0xc4,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)"
                             );
              }
              pGVar9 = Gia_ObjFanin1(pObjRo);
              pObjRo->Value = pGVar9->Value;
            }
          }
          else {
            pGVar9 = Gia_ObjFanin0(pObjRo);
            uVar7 = pGVar9->Value;
            pGVar9 = Gia_ObjFanin1(pObjRo);
            uVar7 = Gia_ManHashAnd(p_00,uVar7,pGVar9->Value);
            pObjRo->Value = uVar7;
          }
          if (pObjRo->Value == 0) {
            __assert_fail("pObj->Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                          ,0xc5,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
          }
        }
      }
      local_58 = local_58 + 1;
    }
    local_58 = 0;
    while( true ) {
      iVar4 = Vec_IntSize(p->vCos);
      bVar11 = false;
      if (local_58 < iVar4) {
        pObjRo = Gia_ManCo(p,local_58);
        bVar11 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      pGVar9 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(ulong *)pGVar9;
      uVar7 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar7) & 1) << 0x1e;
      pGVar9 = Gia_ObjFanin0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xbfffffffffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)pGVar9 >> 0x3e) & 1) << 0x3e;
      pGVar9 = Gia_ObjFanin0(pObjRo);
      pObjRo->Value = pGVar9->Value;
      local_58 = local_58 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  if (local_5c != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0xd0,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  pGVar9 = Gia_ManPo(p,pCex->iPo);
  if (((uint)(*(ulong *)pGVar9 >> 0x1e) & 1) != 1) {
    __assert_fail("pObj->fMark0 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0xd3,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if ((*(ulong *)pGVar9 >> 0x3e & 1) != 0) {
    __assert_fail("pObj->fMark1 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0xd4,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (pGVar9->Value == 0) {
    __assert_fail("pObj->Value > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0xd5,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  Gia_ManAppendCo(p_00,pGVar9->Value);
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

Gia_Man_t * Bmc_CexBuildNetwork2( Gia_Man_t * p, Abc_Cex_t * pCex, int fStart )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit;
    assert( pCex->nRegs == 0 );
    assert( pCex->nPis == Gia_ManCiNum(p) );
    assert( fStart <= pCex->iFrame );
    // start the manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    // set const0
    Gia_ManConst0(p)->fMark0 = 0; // value
    Gia_ManConst0(p)->fMark1 = 1; // care
    Gia_ManConst0(p)->Value  = ~0;
    // set init state
    Gia_ManForEachRi( p, pObj, k )
    {
        pObj->fMark0 = Abc_InfoHasBit( pCex->pData, pCex->nRegs + fStart * Gia_ManCiNum(p) + Gia_ManPiNum(p) + k );
        pObj->fMark1 = 0;
        pObj->Value  = Abc_LitNotCond( Gia_ManAppendCi(pNew), !pObj->fMark0 );
    }
    Gia_ManHashAlloc( pNew );
    iBit = pCex->nRegs + fStart * Gia_ManCiNum(p);
    for ( i = fStart; i <= pCex->iFrame; i++ )
    {
        //  primary inputs
        Gia_ManForEachPi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCex->pData, iBit++ );
            pObj->fMark1 = 1;
            pObj->Value  = ~0;
        }
        iBit += Gia_ManRegNum(p);
        // transfer 
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
            pObjRo->Value  = pObjRi->Value;
        }
        // internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
            pObj->Value = ~0;
            if ( pObj->fMark1 )
                continue;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        // combinational outputs
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            pObj->Value  = Gia_ObjFanin0(pObj)->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( pObj->fMark0 == 1 );
    assert( pObj->fMark1 == 0 );
    assert( pObj->Value > 0 );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}